

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

void __thiscall
sf::priv::GlxContext::updateSettingsFromVisualInfo(GlxContext *this,XVisualInfo *visualInfo)

{
  int sRgb;
  int samples;
  int multiSampling;
  int stencil;
  int depth;
  int local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0xc,(int *)&local_14);
  (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0xd,(int *)&local_18);
  if (SF_GLAD_GLX_ARB_multisample == 0) {
    local_1c = 0;
    local_20 = 0;
  }
  else {
    (*sf_glad_glXGetConfig)(this->m_display,visualInfo,100000,(int *)&local_1c);
    (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0x186a1,(int *)&local_20);
  }
  if (SF_GLAD_GLX_ARB_framebuffer_sRGB == 0 && SF_GLAD_GLX_EXT_framebuffer_sRGB == 0) {
    local_24 = 0;
  }
  else {
    (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0x20b2,&local_24);
  }
  (this->super_GlContext).m_settings.depthBits = local_14;
  (this->super_GlContext).m_settings.stencilBits = local_18;
  if (local_1c != 0) {
    local_1c = local_20;
  }
  (this->super_GlContext).m_settings.antialiasingLevel = local_1c;
  (this->super_GlContext).m_settings.sRgbCapable = local_24 == 1;
  return;
}

Assistant:

void GlxContext::updateSettingsFromVisualInfo(XVisualInfo* visualInfo)
{
    // Update the creation settings from the chosen format
    int depth, stencil, multiSampling, samples, sRgb;
    glXGetConfig(m_display, visualInfo, GLX_DEPTH_SIZE,   &depth);
    glXGetConfig(m_display, visualInfo, GLX_STENCIL_SIZE, &stencil);

    if (SF_GLAD_GLX_ARB_multisample)
    {
        glXGetConfig(m_display, visualInfo, GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
        glXGetConfig(m_display, visualInfo, GLX_SAMPLES_ARB,        &samples);
    }
    else
    {
        multiSampling = 0;
        samples = 0;
    }

    if (SF_GLAD_GLX_EXT_framebuffer_sRGB || SF_GLAD_GLX_ARB_framebuffer_sRGB)
    {
        glXGetConfig(m_display, visualInfo, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
    }
    else
    {
        sRgb = 0;
    }

    m_settings.depthBits         = static_cast<unsigned int>(depth);
    m_settings.stencilBits       = static_cast<unsigned int>(stencil);
    m_settings.antialiasingLevel = multiSampling ? static_cast<unsigned int>(samples) : 0;
    m_settings.sRgbCapable       = (sRgb == True);
}